

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * lj_debug_funcname(lua_State *L,cTValue *frame,char **name)

{
  cTValue *nextframe;
  uint uVar1;
  ulong uVar2;
  BCReg slot;
  bool bVar3;
  BCPos BVar4;
  cTValue *pcVar5;
  char *pcVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  
  if (frame <= (cTValue *)((L->stack).ptr64 + 8)) {
    return (char *)0x0;
  }
  lVar9 = 0;
  if (((frame->u32).lo & 7) == 3) {
    lVar9 = -((ulong)frame->u32 & 0xfffffffffffffff8);
  }
  nextframe = (cTValue *)((long)frame + lVar9);
  uVar2 = *(ulong *)((long)frame + lVar9);
  if ((uVar2 & 3) == 0) {
    pcVar5 = nextframe + (-2 - (ulong)*(byte *)(uVar2 - 3));
  }
  else {
    pcVar5 = (cTValue *)((long)nextframe - (uVar2 & 0xfffffffffffffff8));
  }
  uVar2 = pcVar5[-1].u64;
  BVar4 = debug_framepc(L,(GCfunc *)(uVar2 & 0x7fffffffffff),nextframe);
  if (BVar4 != 0xffffffff) {
    lVar9 = *(long *)((long)(uVar2 & 0x7fffffffffff) + 0x20);
    uVar1 = *(uint *)(lVar9 + (ulong)BVar4 * 4);
    pcVar6 = (char *)((ulong)uVar1 & 0xff);
    uVar8 = (uint)(lj_bc_mode[(long)pcVar6] >> 0xb);
    if (uVar8 == 0x16) {
      bVar3 = true;
    }
    else {
      if (uVar8 == 9) {
        bVar7 = (byte)(uVar1 >> 8);
        slot = bVar7 - 3;
        if ((int)pcVar6 != 0x45) {
          slot = (uint)bVar7;
        }
        pcVar6 = lj_debug_slotname((GCproto *)(lVar9 + -0x68),(BCIns *)(lVar9 + (ulong)BVar4 * 4),
                                   slot,name);
      }
      else {
        *name = (char *)(*(long *)((L->glref).ptr64 + 0x1a8 + (ulong)uVar8 * 8) + 0x18);
        pcVar6 = "metamethod";
      }
      bVar3 = false;
    }
    if (!bVar3) {
      return pcVar6;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_funcname(lua_State *L, cTValue *frame, const char **name)
{
  cTValue *pframe;
  GCfunc *fn;
  BCPos pc;
  if (frame <= tvref(L->stack)+LJ_FR2)
    return NULL;
  if (frame_isvarg(frame))
    frame = frame_prevd(frame);
  pframe = frame_prev(frame);
  fn = frame_func(pframe);
  pc = debug_framepc(L, fn, frame);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    const BCIns *ip = &proto_bc(pt)[check_exp(pc < pt->sizebc, pc)];
    MMS mm = bcmode_mm(bc_op(*ip));
    if (mm == MM_call) {
      BCReg slot = bc_a(*ip);
      if (bc_op(*ip) == BC_ITERC) slot -= 3;
      return lj_debug_slotname(pt, ip, slot, name);
    } else if (mm != MM__MAX) {
      *name = strdata(mmname_str(G(L), mm));
      return "metamethod";
    }
  }
  return NULL;
}